

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void * myReallocFunc(void *mem,size_t size)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = (void *)xmlMemRealloc();
  if (pvVar2 != (void *)0x0) {
    iVar1 = xmlMemUsed();
    if (maxmem < iVar1) {
      myReallocFunc_cold_1();
      pvVar2 = (void *)0x0;
    }
  }
  return pvVar2;
}

Assistant:

static void *
myReallocFunc(void *mem, size_t size)
{
    void *ret;

    ret = xmlMemRealloc(mem, size);
    if (ret != NULL) {
        if (xmlMemUsed() > maxmem) {
            OOM();
            xmlMemFree(ret);
            return (NULL);
        }
    }
    return (ret);
}